

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_workdir(void)

{
  int iVar1;
  char local_1018 [4];
  int result;
  char cwd [4096];
  int local_c;
  
  iVar1 = adksys_get_cwd(local_1018,0x1000);
  if (iVar1 == 1) {
    local_c = -1;
  }
  else {
    local_c = adiak_namevalue("working_directory",2,"runinfo","%p",local_1018);
  }
  return local_c;
}

Assistant:

int adiak_workdir()
{
   char cwd[FILENAME_MAX];
   int result = adksys_get_cwd(cwd, FILENAME_MAX);
   if (result == 1)
      return -1;
   result = adiak_namevalue("working_directory", adiak_general, "runinfo", "%p", cwd);
   return result;
}